

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O2

digits_t icu_63::number::impl::roundingutils::doubleFractionLength(double input)

{
  bool sign;
  int32_t point;
  int32_t length;
  char buffer [18];
  
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (input,SHORTEST,0,buffer,0x12,&sign,&length,&point);
  return (short)length - (short)point;
}

Assistant:

digits_t roundingutils::doubleFractionLength(double input) {
    char buffer[DoubleToStringConverter::kBase10MaximalLength + 1];
    bool sign; // unused; always positive
    int32_t length;
    int32_t point;
    DoubleToStringConverter::DoubleToAscii(
            input,
            DoubleToStringConverter::DtoaMode::SHORTEST,
            0,
            buffer,
            sizeof(buffer),
            &sign,
            &length,
            &point
    );

    return static_cast<digits_t>(length - point);
}